

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cc
# Opt level: O3

int main(void)

{
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this;
  mapped_type *this_00;
  Application app;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  key_type local_158;
  key_type local_138;
  Application local_118;
  
  webpp::Server::Server(&local_118.server,0x3039,4);
  local_118.routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.routes._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.routes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.port = 0x3039;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_118.routes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"/","");
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_160 = std::
              _Function_handler<std::shared_ptr<webpp::Response>_(webpp::Request_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Ariaszzzhc[P]webpp11/examples/hello.cc:9:22)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<std::shared_ptr<webpp::Response>_(webpp::Request_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Ariaszzzhc[P]webpp11/examples/hello.cc:9:22)>
              ::_M_manager;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"GET","");
  this = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>_>_>_>_>_>_>
            ::operator[](&local_118.routes,&local_138);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](this,&local_158);
  std::function<std::shared_ptr<webpp::Response>_(webpp::Request_&)>::operator=
            (this_00,(function<std::shared_ptr<webpp::Response>_(webpp::Request_&)> *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  webpp::Application::run(&local_118);
  std::_Rb_tree<$6a9662d5$>::~_Rb_tree(&local_118.routes._M_t);
  webpp::Server::~Server(&local_118.server);
  return 0;
}

Assistant:

int main() {
  Application app(12345, 4);

  app.add_route("/", [](Request& request) {
    auto response = make_shared<Response>("Hello, World!");

    return response;
  });

  app.run();

  return 0;
}